

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

value * __thiscall
mjs::anon_unknown_35::parse_float
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  void *pvVar1;
  wistream *pwVar2;
  size_t sVar3;
  long *plVar4;
  wstring_view wVar5;
  double val;
  wistringstream wiss;
  long *local_1b8 [2];
  long local_1a8 [2];
  wstring local_198 [120];
  ios_base local_120 [264];
  
  sVar3 = s._M_len;
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  wVar5._M_str._0_4_ = *(undefined4 *)((long)pvVar1 + 0x20);
  wVar5._M_len = s._M_len;
  wVar5._M_str._4_4_ = 0;
  wVar5 = ltrim((mjs *)global,wVar5,(version)sVar3);
  local_1b8[0] = local_1a8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_1b8,wVar5._M_str,wVar5._M_str + wVar5._M_len);
  std::__cxx11::wistringstream::basic_istringstream(local_198,(_Ios_Openmode)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] * 4 + 4);
  }
  pwVar2 = std::wistream::_M_extract<double>((double *)local_198);
  plVar4 = local_1b8[0];
  if (((byte)pwVar2[*(long *)(*(long *)pwVar2 + -0x18) + 0x20] & 5) != 0) {
    plVar4 = (long *)0x7ff8000000000000;
  }
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = (double)plVar4;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_198);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

value parse_float(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wistringstream wiss{std::wstring{ltrim(s, global->language_version())}};
    double val;
    return value{wiss >> val ? val : NAN};
}